

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

int archive_read_support_filter_program_signature
              (archive *_a,char *cmd,void *signature,size_t signature_len)

{
  int iVar1;
  program_bidder *state_00;
  char *pcVar2;
  program_bidder *state;
  archive_read_filter_bidder *bidder;
  archive_read *a;
  size_t signature_len_local;
  void *signature_local;
  char *cmd_local;
  archive *_a_local;
  
  bidder = (archive_read_filter_bidder *)_a;
  a = (archive_read *)signature_len;
  signature_len_local = (size_t)signature;
  signature_local = cmd;
  cmd_local = (char *)_a;
  iVar1 = __archive_read_get_bidder((archive_read *)_a,(archive_read_filter_bidder **)&state);
  if (iVar1 == 0) {
    state_00 = (program_bidder *)calloc(1,0x28);
    if (state_00 != (program_bidder *)0x0) {
      pcVar2 = strdup((char *)signature_local);
      state_00->cmd = pcVar2;
      if (state_00->cmd != (char *)0x0) {
        iVar1 = set_bidder_signature
                          ((archive_read_filter_bidder *)state,state_00,(void *)signature_len_local,
                           (size_t)a);
        return iVar1;
      }
    }
    free_state(state_00);
    archive_set_error((archive *)cmd_local,0xc,"Can\'t allocate memory");
  }
  return -0x1e;
}

Assistant:

int
archive_read_support_filter_program_signature(struct archive *_a,
    const char *cmd, const void *signature, size_t signature_len)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *bidder;
	struct program_bidder *state;

	/*
	 * Get a bidder object from the read core.
	 */
	if (__archive_read_get_bidder(a, &bidder) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Allocate our private state.
	 */
	state = (struct program_bidder *)calloc(1, sizeof (*state));
	if (state == NULL)
		goto memerr;
	state->cmd = strdup(cmd);
	if (state->cmd == NULL)
		goto memerr;

	return set_bidder_signature(bidder, state, signature, signature_len);
memerr:
	free_state(state);
	archive_set_error(_a, ENOMEM, "Can't allocate memory");
	return (ARCHIVE_FATAL);
}